

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::output_rank_example(vw *all,example *head_ec,bool *hit_loss,multi_ex *ec_seq)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  _Ios_Openmode _Var4;
  ulong uVar5;
  reference ppeVar6;
  action_score *paVar7;
  int **ppiVar8;
  size_t sVar9;
  wclass *pwVar10;
  ostream *poVar11;
  undefined8 in_RCX;
  byte *in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t i;
  stringstream outputStringStream;
  string outputString;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  example *ex;
  iterator __end2;
  iterator __begin2;
  multi_ex *__range2;
  size_t idx;
  v_array<ACTION_SCORE::action_score> *preds;
  float loss;
  v_array<COST_SENSITIVE::wclass> costs;
  label *ld;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  example *in_stack_fffffffffffffd08;
  code *pcVar12;
  string local_280 [32];
  ulong local_260;
  stringstream local_248 [16];
  ostream local_238;
  v_array<char> *in_stack_ffffffffffffff30;
  v_array<ACTION_SCORE::action_score> *in_stack_ffffffffffffff38;
  string local_c0 [4];
  int in_stack_ffffffffffffff44;
  uint32_t in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined1 action_scores;
  example *ec_seq_00;
  example *ec;
  v_array<int> *this;
  undefined1 is_test;
  example *in_stack_ffffffffffffff80;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_70;
  undefined8 local_68;
  ulong local_60;
  v_array<ACTION_SCORE::action_score> *local_58;
  float local_4c;
  v_array<COST_SENSITIVE::wclass> local_48;
  undefined8 *local_28;
  undefined8 local_20;
  byte *local_18;
  long local_10;
  long *local_8;
  
  local_28 = (undefined8 *)(in_RSI + 0x6828);
  local_48._begin = (wclass *)*local_28;
  local_48._end = *(wclass **)(in_RSI + 0x6830);
  local_48.end_array = *(wclass **)(in_RSI + 0x6838);
  local_48.erase_count = *(size_t *)(in_RSI + 0x6840);
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar3 = example_is_newline((example *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  if ((iVar3 == 0) && (bVar2 = ec_is_label_definition(in_stack_fffffffffffffd08), !bVar2)) {
    *(long *)(*local_8 + 0x10) = *(long *)(local_10 + 0x68a0) + *(long *)(*local_8 + 0x10);
    local_4c = 0.0;
    local_58 = (v_array<ACTION_SCORE::action_score> *)(local_10 + 0x6850);
    uVar5 = (*(code *)PTR_test_label_0048ff70)(local_10 + 0x6828);
    if ((uVar5 & 1) == 0) {
      local_60 = 0;
      local_68 = local_20;
      local_70._M_current =
           (example **)
           std::vector<example_*,_std::allocator<example_*>_>::begin
                     ((vector<example_*,_std::allocator<example_*>_> *)
                      CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      std::vector<example_*,_std::allocator<example_*>_>::end
                ((vector<example_*,_std::allocator<example_*>_> *)
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)),
            bVar2) {
        ppeVar6 = __gnu_cxx::
                  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                  ::operator*(&local_70);
        in_stack_ffffffffffffff80 = *ppeVar6;
        if ((*local_18 & 1) != 0) break;
        paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_58,0);
        if (paVar7->action == local_60) {
          pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[]
                              ((v_array<COST_SENSITIVE::wclass> *)
                               &(in_stack_ffffffffffffff80->l).simple,0);
          local_4c = pwVar10->x;
          *local_18 = 1;
        }
        local_60 = local_60 + 1;
        __gnu_cxx::
        __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
        operator++(&local_70);
      }
      *(double *)(*local_8 + 0x40) = (double)local_4c + *(double *)(*local_8 + 0x40);
      *(double *)(*local_8 + 0x48) = (double)local_4c + *(double *)(*local_8 + 0x48);
    }
    this = (v_array<int> *)(local_8 + 0x6a2);
    ppiVar8 = v_array<int>::begin(this);
    ec = (example *)*ppiVar8;
    ppiVar8 = v_array<int>::end(this);
    ec_seq_00 = (example *)*ppiVar8;
    while( true ) {
      is_test = (undefined1)((ulong)this >> 0x38);
      action_scores = (undefined1)((uint)in_stack_ffffffffffffff64 >> 0x18);
      if (ec == ec_seq_00) break;
      in_stack_ffffffffffffff64 =
           *(int *)&((_Vector_impl_data *)&(ec->super_example_predict).indices._begin)->_M_start;
      ACTION_SCORE::print_action_score
                (in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      ec = (example *)
           ((long)&((_Vector_impl_data *)&(ec->super_example_predict).indices._begin)->_M_start + 4)
      ;
    }
    if (0 < (int)local_8[0x6a6]) {
      std::__cxx11::string::string(local_c0);
      _Var4 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_248,local_c0,_Var4);
      local_260 = 0;
      while( true ) {
        uVar5 = local_260;
        sVar9 = v_array<COST_SENSITIVE::wclass>::size(&local_48);
        is_test = (undefined1)((ulong)this >> 0x38);
        action_scores = (undefined1)((uint)in_stack_ffffffffffffff64 >> 0x18);
        if (sVar9 <= uVar5) break;
        if (local_260 != 0) {
          std::operator<<(&local_238,' ');
        }
        pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[](&local_48,local_260);
        poVar11 = (ostream *)std::ostream::operator<<(&local_238,pwVar10->class_index);
        poVar11 = std::operator<<(poVar11,':');
        pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[](&local_48,local_260);
        std::ostream::operator<<(poVar11,pwVar10->partial_prediction);
        local_260 = local_260 + 1;
      }
      pcVar12 = (code *)local_8[0x6a8];
      lVar1 = local_8[0x6a6];
      std::__cxx11::stringstream::str();
      (*pcVar12)((int)lVar1,local_280);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::stringstream::~stringstream(local_248);
      std::__cxx11::string::~string(local_c0);
    }
    (*(code *)PTR_test_label_0048ff70)(local_10 + 0x6828);
    COST_SENSITIVE::print_update
              ((vw *)in_stack_ffffffffffffff80,(bool)is_test,ec,(multi_ex *)ec_seq_00,
               (bool)action_scores,in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

void output_rank_example(vw& all, example& head_ec, bool& hit_loss, multi_ex* ec_seq)
{
  label& ld = head_ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(head_ec))
    return;
  if (ec_is_label_definition(head_ec))
    return;

  all.sd->total_features += head_ec.num_features;

  float loss = 0.;
  v_array<action_score>& preds = head_ec.pred.a_s;

  if (!COST_SENSITIVE::cs_label.test_label(&head_ec.l))
  {
    size_t idx = 0;
    for (example* ex : *ec_seq)
    {
      if (hit_loss)
        break;
      if (preds[0].action == idx)
      {
        loss = ex->l.cs.costs[0].x;
        hit_loss = true;
      }
      idx++;
    }
    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
    assert(loss >= 0);
  }

  for (int sink : all.final_prediction_sink) print_action_score(sink, head_ec.pred.a_s, head_ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    // outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), head_ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&head_ec.l), head_ec, ec_seq, true, 0);
}